

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

bool llvm::is_contained<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&,llvm::cl::SubCommand*>
               (SmallPtrSet<llvm::cl::SubCommand_*,_4U> *Range,SubCommand **Element)

{
  bool bVar1;
  SmallPtrSetIteratorImpl local_58;
  SmallPtrSetIteratorImpl local_48;
  SmallPtrSetIteratorImpl local_38;
  SmallPtrSetIteratorImpl local_28;
  SubCommand **local_18;
  SubCommand **Element_local;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *Range_local;
  
  local_18 = Element;
  Element_local = (SubCommand **)Range;
  local_38 = (SmallPtrSetIteratorImpl)adl_begin<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&>(Range)
  ;
  local_48 = (SmallPtrSetIteratorImpl)
             adl_end<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&>
                       ((SmallPtrSet<llvm::cl::SubCommand_*,_4U> *)Element_local);
  local_28 = (SmallPtrSetIteratorImpl)
             std::find<llvm::SmallPtrSetIterator<llvm::cl::SubCommand*>,llvm::cl::SubCommand*>
                       ((SmallPtrSetIterator<llvm::cl::SubCommand_*>)local_38,
                        (SmallPtrSetIterator<llvm::cl::SubCommand_*>)local_48,local_18);
  local_58 = (SmallPtrSetIteratorImpl)
             adl_end<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&>
                       ((SmallPtrSet<llvm::cl::SubCommand_*,_4U> *)Element_local);
  bVar1 = SmallPtrSetIteratorImpl::operator!=(&local_28,&local_58);
  return bVar1;
}

Assistant:

bool is_contained(R &&Range, const E &Element) {
  return std::find(adl_begin(Range), adl_end(Range), Element) != adl_end(Range);
}